

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

Result __thiscall Lexer::lex(Lexer *this,string *fn)

{
  int iVar1;
  Action AVar2;
  ulong uVar3;
  char *__filename;
  TextPos *args_1;
  vector<Token,_std::allocator<Token>_> *this_00;
  FILE *local_50;
  TokenKind local_40 [4];
  Scoped_fclose local_30;
  Scoped_fclose fc;
  FILE *f;
  string *fn_local;
  Lexer *this_local;
  
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    __filename = (char *)std::__cxx11::string::c_str();
    local_50 = fopen(__filename,"r");
  }
  else {
    local_50 = _stdin;
  }
  fc.f = (FILE *)local_50;
  if (local_50 == (FILE *)0x0) {
    this_local._4_4_ = ErrorOpeningFile;
  }
  else {
    Scoped_fclose::Scoped_fclose(&local_30,(FILE *)local_50);
    std::__cxx11::string::operator=((string *)&this->data,(string *)fn);
    this_00 = &(this->data).tokens;
    std::vector<Token,_std::allocator<Token>_>::clear(this_00);
    std::vector<Token,_std::allocator<Token>_>::reserve(this_00,0x80);
    this->state = ReadingWhitespace;
    this->prepro = false;
    CharReader::set_file(&this->reader,fc.f);
    do {
      iVar1 = CharReader::nextchar(&this->reader);
      this->chr = iVar1;
      do {
        AVar2 = process(this);
      } while (AVar2 == ProcessChr);
    } while (this->chr != 0);
    iVar1 = CharReader::readed_bytes(&this->reader);
    (this->data).readed_bytes = iVar1;
    local_40[0] = Eof;
    args_1 = CharReader::pos(&this->reader);
    LexData::add_token<TokenKind,TextPos_const&>(&this->data,local_40,args_1);
    this_local._4_4_ = OK;
    Scoped_fclose::~Scoped_fclose(&local_30);
  }
  return this_local._4_4_;
}

Assistant:

Lexer::Result Lexer::lex(const std::string& fn)
{
  std::FILE* f = (fn.empty() ? stdin: std::fopen(fn.c_str(), "r"));
  if (!f)
    return Lexer::Result::ErrorOpeningFile;

  Scoped_fclose fc(f);

  data.fn = fn;
  data.tokens.clear();
  data.tokens.reserve(128); // TODO This number might depend on the
                            //      size of the input file
  state = LexState::ReadingWhitespace;
  prepro = false;

  reader.set_file(f);
  do {
    chr = reader.nextchar();
    while (process() == Action::ProcessChr)
      ;
  } while (chr);
  data.readed_bytes = reader.readed_bytes();
  data.add_token(TokenKind::Eof, reader.pos());
  return Lexer::Result::OK;
}